

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,StringRef name,StringRef attribute)

{
  ostream *poVar1;
  char local_49;
  XmlEncode local_48;
  
  if (attribute.m_size != 0 && name.m_size != 0) {
    local_48.m_str.m_start = (char *)CONCAT71(local_48.m_str.m_start._1_7_,0x20);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->m_os,(char *)&local_48,1);
    poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)name.m_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
    local_48.m_forWhat = ForAttributes;
    local_48.m_str.m_start = attribute.m_start;
    local_48.m_str.m_size = attribute.m_size;
    XmlEncode::encodeTo(&local_48,poVar1);
    local_49 = '\"';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_49,1);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( StringRef name,
                                          StringRef attribute ) {
        if( !name.empty() && !attribute.empty() )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }